

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O2

RGBColor __thiscall pm::Phong::shade(Phong *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  Vector3 *in_RDX;
  uint uVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar9;
  float fVar10;
  RGBColor RVar11;
  Vector3 wi;
  RGBColor local_b0;
  int local_a4;
  undefined4 uStack_a0;
  float local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  ShadeRecord *local_78;
  undefined1 local_70 [8];
  float local_68;
  _func_int **local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  Vector3 local_40;
  
  local_40.z = -in_RDX[6].x;
  local_40.x = in_RDX[5].y;
  local_40.y = in_RDX[5].z;
  local_40._0_8_ = local_40._0_8_ ^ 0x8000000080000000;
  fVar8 = (sr->ray).o.y;
  uVar1 = *(undefined8 *)&(sr->normal).z;
  fVar10 = (float)uVar1;
  fVar7 = (float)((ulong)uVar1 >> 0x20);
  local_88._4_4_ = fVar7;
  local_88._0_4_ = fVar10 * (sr->ray).o.z;
  local_88._8_8_ = 0;
  (**(code **)(**(long **)(*(long *)(in_RDX + 8) + 0x70) + 0x18))(&local_b0);
  fVar9 = (float)local_88._0_4_ * local_b0.b;
  fVar7 = local_b0.r * fVar10 * fVar7;
  fVar8 = local_b0.g * fVar8 * fVar10;
  (this->super_Material)._vptr_Material = (_func_int **)CONCAT44(fVar8,fVar7);
  (this->super_Material).type_ = (Type)fVar9;
  lVar2 = *(long *)(*(long *)(in_RDX + 8) + 0x80);
  lVar3 = *(long *)(*(long *)(in_RDX + 8) + 0x78);
  local_78 = sr + 1;
  uVar6 = 0;
  do {
    if ((ulong)(lVar2 - lVar3 >> 3) <= (ulong)uVar6) {
      RVar11.g = fVar8;
      RVar11.r = fVar7;
      RVar11.b = fVar9;
      return RVar11;
    }
    plVar4 = *(long **)(*(long *)(*(long *)(in_RDX + 8) + 0x78) + (ulong)uVar6 * 8);
    (**(code **)(*plVar4 + 0x10))(&local_50,plVar4);
    fVar7 = (float)local_50;
    fVar8 = SUB84(local_50,4);
    fVar10 = in_RDX[4].x * local_48 + in_RDX[3].y * fVar7 + fVar8 * in_RDX[3].z;
    fVar9 = local_48;
    if (0.0 < fVar10) {
      local_88 = ZEXT416((uint)fVar10);
      if (*(char *)((long)plVar4 + 0xc) == '\x01') {
        local_b0.r = in_RDX[1].y;
        local_b0.g = in_RDX[1].z;
        local_b0.b = in_RDX[2].x;
        local_a4 = (int)local_50;
        uStack_a0 = local_50._4_4_;
        local_9c = local_48;
        cVar5 = (**(code **)(*plVar4 + 0x20))(plVar4,&local_b0);
        fVar7 = extraout_XMM0_Da;
        fVar8 = extraout_XMM0_Db;
        if (cVar5 != '\0') goto LAB_00111260;
      }
      fVar7 = SUB84(sr->world,0);
      fVar8 = *(float *)((long)&sr->tracer + 4);
      local_98 = fVar7 * (float)((ulong)sr->world >> 0x20) * 0.31830987;
      fStack_94 = *(float *)&sr->tracer * fVar7 * 0.31830987;
      fStack_90 = 0.0;
      fStack_8c = 0.0;
      RVar11 = GlossySpecular::f((GlossySpecular *)&stack0xffffffffffffffa0,local_78,in_RDX,
                                 &local_40);
      local_98 = SUB84(local_60,0) + local_98;
      fStack_94 = (float)((ulong)local_60 >> 0x20) + fStack_94;
      fStack_90 = fStack_90 + 0.0;
      fStack_8c = fStack_8c + 0.0;
      fVar8 = fVar7 * fVar8 * 0.31830987 + local_58;
      (**(code **)(*plVar4 + 0x18))(fVar8,RVar11.b,local_70,plVar4);
      fVar9 = (float)local_88._0_4_ * local_70._0_4_ * local_98;
      local_b0.b = fVar8 * local_68 * (float)local_88._0_4_;
      local_b0.g = (float)local_88._0_4_ * local_70._4_4_ * fStack_94;
      local_b0.r = fVar9;
      RGBColor::operator+=((RGBColor *)this,&local_b0);
      fVar7 = extraout_XMM0_Da_00;
      fVar8 = extraout_XMM0_Db_00;
    }
LAB_00111260:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

RGBColor Phong::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += (diffuseBrdf_.f(sr, wo, wi) + specularBrdf_.f(sr, wo, wi)) * light.L(sr) * nDotWi;
		}
	}

	return L;
}